

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O3

idx_t duckdb::ExpressionHeuristics::ExpressionCost(BoundCaseExpression *expr)

{
  pointer pBVar1;
  type pEVar2;
  idx_t iVar3;
  idx_t iVar4;
  BoundCaseCheck *case_check;
  pointer this;
  long lVar5;
  
  this = (expr->case_checks).
         super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
         super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl
         .super__Vector_impl_data._M_start;
  pBVar1 = (expr->case_checks).
           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this == pBVar1) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this->then_expr);
      iVar3 = Cost(pEVar2);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this->when_expr);
      iVar4 = Cost(pEVar2);
      lVar5 = iVar4 + lVar5 + iVar3;
      this = this + 1;
    } while (this != pBVar1);
  }
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->else_expr);
  iVar3 = Cost(pEVar2);
  return iVar3 + lVar5;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(BoundCaseExpression &expr) {
	// CASE WHEN check THEN result_if_true ELSE result_if_false END
	idx_t case_cost = 0;
	for (auto &case_check : expr.case_checks) {
		case_cost += Cost(*case_check.then_expr);
		case_cost += Cost(*case_check.when_expr);
	}
	case_cost += Cost(*expr.else_expr);
	return case_cost;
}